

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void init_dsmotion_compensation(search_site_config *cfg,int stride,int level)

{
  FULLPEL_MV FVar1;
  FULLPEL_MV *mv;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  search_site *site;
  int i;
  FULLPEL_MV search_site_mvs [13];
  int num_search_pts;
  int radius;
  int first_step;
  int stage_index;
  int num_search_steps;
  int *local_70;
  int local_5c;
  FULLPEL_MV local_58;
  short local_54;
  undefined2 local_52;
  short local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  short local_38;
  short local_36;
  int aiStack_34 [4];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_14 = 0;
  local_18 = 10;
  *(undefined2 *)(in_RDI + 0x550) = 0;
  *(undefined2 *)(in_RDI + 0x552) = 0;
  *(undefined4 *)(in_RDI + 0x554) = 0;
  *(int *)(in_RDI + 0xc64) = in_ESI;
  local_20 = 0x400;
  local_1c = local_20;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (0 < in_EDX) {
    local_20 = 0x100;
    local_1c = local_20;
  }
  while (0 < local_20) {
    local_24 = 8;
    local_58.row = 0;
    local_58.col = 0;
    local_50 = (short)local_20;
    local_54 = -local_50;
    local_52 = 0;
    local_4e = 0;
    local_4c = 0;
    local_4a = -local_50;
    local_48 = 0;
    local_44 = -local_50;
    local_42 = -local_50;
    local_3c = -local_50;
    local_36 = -local_50;
    local_70 = aiStack_34;
    local_46 = local_50;
    local_40 = local_50;
    local_3e = local_50;
    local_3a = local_50;
    local_38 = local_50;
    do {
      memset(local_70,0,4);
      local_70 = local_70 + 1;
    } while (local_70 != &local_24);
    for (local_5c = 0; local_5c <= local_24; local_5c = local_5c + 1) {
      mv = (FULLPEL_MV *)(local_8 + (long)local_18 * 0x88 + (long)local_5c * 8);
      *mv = (&local_58)[local_5c];
      FVar1 = (FULLPEL_MV)get_offset_from_fullmv(mv,local_c);
      mv[1] = FVar1;
    }
    *(int *)(local_8 + 0xbb4 + (long)local_18 * 4) = local_24;
    *(int *)(local_8 + 0xc0c + (long)local_18 * 4) = local_20;
    if ((local_10 == 0) || ((local_18 < 9 && (local_10 != 0)))) {
      local_20 = local_20 / 2;
    }
    local_18 = local_18 + -1;
    local_14 = local_14 + 1;
  }
  *(int *)(local_8 + 0xbb0) = local_14;
  return;
}

Assistant:

static void init_dsmotion_compensation(search_site_config *cfg, int stride,
                                       int level) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  // Choose the initial step size depending on level.
  const int first_step = (level > 0) ? (MAX_FIRST_STEP / 4) : MAX_FIRST_STEP;

  for (int radius = first_step; radius > 0;) {
    int num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },           { -radius, 0 },      { radius, 0 },
      { 0, -radius },     { 0, radius },       { -radius, -radius },
      { radius, radius }, { -radius, radius }, { radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    // Update the search radius based on level.
    if (!level || ((stage_index < 9) && level)) radius /= 2;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}